

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::GetYieldNR
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double massNum,vector<double,_std::allocator<double>_> *NRYieldsParam)

{
  bool bVar1;
  size_type sVar2;
  runtime_error *prVar3;
  RandomGen *this_00;
  const_reference pvVar4;
  ostream *poVar5;
  uint __x;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  Wvalue WVar12;
  double local_f0;
  YieldResult result;
  double L;
  double Wq_eV;
  Wvalue wvalue;
  double NexONi;
  double Nex;
  double Ni;
  double Nph;
  double Ne;
  double Ly;
  double Qy;
  double ThomasImel;
  double Nq;
  double ScaleFactor [2];
  int massNumber;
  vector<double,_std::allocator<double>_> *NRYieldsParam_local;
  double massNum_local;
  double dfield_local;
  double density_local;
  double energy_local;
  NESTcalc *this_local;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  NRYieldsParam_local = (vector<double,_std::allocator<double>_> *)massNum;
  if (bVar1) {
    NRYieldsParam_local =
         (vector<double,_std::allocator<double>_> *)VDetector::get_molarMass(this->fdetector);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size(NRYieldsParam);
  if (sVar2 < 0xc) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"ERROR: You need a minimum of 12 nuisance parameters for the mean yields.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (330.0 < energy) {
    std::operator<<((ostream *)&std::cerr,
                    "\nWARNING: No data out here, you are beyond the AmBe endpoint of about 300 keV.\n"
                   );
  }
  bVar1 = ValidityTests::nearlyEqual((double)NRYieldsParam_local,0.0,1e-09);
  if (bVar1) {
    this_00 = RandomGen::rndm();
    ScaleFactor[1]._0_4_ = RandomGen::SelectRanXeAtom(this_00);
  }
  else {
    ScaleFactor[1]._0_4_ = (int)(double)NRYieldsParam_local;
  }
  dVar6 = VDetector::get_molarMass(this->fdetector);
  dVar7 = sqrt(dVar6 / (double)ScaleFactor[1]._0_4_);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,0);
  dVar6 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,1);
  dVar8 = pow(energy,*pvVar4);
  ThomasImel = dVar6 * dVar8 + 0.0;
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  if ((!bVar1) && (bVar1 = ValidityTests::nearlyEqual(54.0,54.0,1e-09), bVar1)) {
    ThomasImel = ThomasImel * 1.1716263232;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,2);
  dVar6 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,3);
  dVar8 = pow(dfield,*pvVar4);
  dVar9 = pow(density / 2.9,0.3);
  dVar9 = dVar6 * dVar8 * dVar9;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,4);
  dVar6 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,9);
  dVar8 = pow(energy + dVar6,*pvVar4);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,5);
  dVar6 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,6);
  dVar6 = pow(energy / dVar6,*pvVar4);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,10);
  dVar6 = pow(dVar6 + 1.0,*pvVar4);
  Ly = (1.0 - 1.0 / dVar6) * (1.0 / (dVar9 * dVar8));
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  if (!bVar1) {
    Ly = Ly * 1.08;
  }
  Ne = ThomasImel / energy - Ly;
  if (Ly < 0.0) {
    Ly = 0.0;
  }
  if (Ne < 0.0) {
    Ne = 0.0;
  }
  dVar8 = Ly * energy * dVar7;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,7);
  dVar6 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,8);
  dVar6 = pow(energy / dVar6,*pvVar4);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](NRYieldsParam,0xb);
  dVar6 = pow(dVar6 + 1.0,*pvVar4);
  dVar6 = (1.0 - 1.0 / dVar6) * Ne * energy * dVar7;
  dVar7 = dVar6 + dVar8;
  dVar10 = exp((dVar8 * dVar9) / 4.0);
  dVar11 = exp((dVar8 * dVar9) / 4.0);
  NexONi = (-1.0 / dVar9) * ((dVar11 * 4.0 + -((dVar8 + dVar6) * dVar9)) - 4.0);
  wvalue.alpha = NexONi / ((4.0 / dVar9) * (dVar10 - 1.0));
  dVar9 = VDetector::get_molarMass(this->fdetector);
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  __x = (uint)bVar1;
  WVar12 = WorkFunction(density,dVar9,bVar1);
  wvalue.Wq_eV = WVar12.alpha;
  if ((wvalue.alpha < wvalue.Wq_eV) && (100.0 < energy)) {
    wvalue.alpha = wvalue.Wq_eV;
    NexONi = dVar7 - dVar7 / (wvalue.Wq_eV + 1.0);
  }
  if ((1.0 < wvalue.alpha) && (energy < 1.0)) {
    wvalue.alpha = 1.0;
    NexONi = dVar7 - dVar7 / 2.0;
  }
  if ((NexONi < 0.0) && (1.0 <= density)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "\nCAUTION: You are approaching the border of NEST\'s validity for high-energy (OR, for LOW) NR, or are beyond it, at "
                            );
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,energy);
    poVar5 = std::operator<<(poVar5," keV.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __x = (uint)poVar5;
  }
  std::abs(__x);
  if (extraout_XMM0_Qa <= 2e-06) {
    Wq_eV = WVar12.Wq_eV;
    result.DeltaT_Scint = (dVar7 / energy) * Wq_eV * 0.001;
    memset(&local_f0,0,0x30);
    result.ElectronYield = wvalue.alpha;
    result.ExcitonRatio = result.DeltaT_Scint;
    result.ElectricField = -999.0;
    local_f0 = dVar6;
    result.PhotonYield = dVar8;
    result.Lindhard = dfield;
    (*this->_vptr_NESTcalc[0xb])(energy,Wq_eV,__return_storage_ptr__,this,&local_f0);
    return __return_storage_ptr__;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"ERROR: Quanta not conserved. Tell Matthew Immediately!")
  ;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

YieldResult NESTcalc::GetYieldNR(double energy, double density, double dfield,
                                 double massNum,
                                 const std::vector<double> &NRYieldsParam) {
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))
    massNum = fdetector->get_molarMass();

  if (NRYieldsParam.size() < 12) {
    throw std::runtime_error(
        "ERROR: You need a minimum of 12 nuisance parameters for the mean "
        "yields.");
  }
  if (energy > HIGH_E_NR)
    cerr << "\nWARNING: No data out here, you are beyond the AmBe endpoint of "
            "about 300 keV.\n";
  int massNumber;
  double ScaleFactor[2] = {1., 1.};
  if (ValidityTests::nearlyEqual(massNum, 0.))
    massNumber = RandomGen::rndm()->SelectRanXeAtom();
  else {
    massNumber = int(massNum);
  }
  ScaleFactor[0] = sqrt(fdetector->get_molarMass() / (double)massNumber);
  ScaleFactor[1] = ScaleFactor[0];
  double Nq = NRYieldsParam[0] * pow(energy, NRYieldsParam[1]) + McMConst;
  if (!fdetector->get_OldW13eV() && ValidityTests::nearlyEqual(ATOM_NUM, 54.)) Nq *= ZurichEXOW;
  double ThomasImel = NRYieldsParam[2] * pow(dfield, NRYieldsParam[3]) *
                      pow(density / DENSITY, 0.3);
  double Qy =
      1. / (ThomasImel * pow(energy + NRYieldsParam[4], NRYieldsParam[9]));
  Qy *= 1. - 1. / pow(1. + pow((energy / NRYieldsParam[5]), NRYieldsParam[6]),
                      NRYieldsParam[10]);
  if (!fdetector->get_OldW13eV()) Qy *= ZurichEXOQ;
  double Ly = Nq / energy - Qy;
  if (Qy < 0.0) Qy = 0.0;
  if (Ly < 0.0) Ly = 0.0;
  double Ne = Qy * energy * ScaleFactor[1];
  double Nph =
      Ly * energy * ScaleFactor[0];
  if (McMConst == 0.0) {
  	Nph *= (1. - 1. / pow(1. + pow((energy / NRYieldsParam[7]), NRYieldsParam[8]), NRYieldsParam[11]));
  }
  Nq = Nph + Ne;
  double Ni = (4. / ThomasImel) * (exp(Ne * ThomasImel / 4.) - 1.);
  double Nex = (-1. / ThomasImel) *
               (4. * exp(Ne * ThomasImel / 4.) - (Ne + Nph) * ThomasImel - 4.);

  double NexONi = Nex / Ni;
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  if (NexONi < wvalue.alpha && energy > 1e2) {
    NexONi = wvalue.alpha;
    Ni = Nq / (1. + NexONi);
    Nex = Nq - Ni;
  }
  if (NexONi > 1.0 && energy < 1.) {
    NexONi = 1.00;
    Ni = Nq / (1. + NexONi);
    Nex = Nq - Ni;
  }

  if (Nex < 0. && density >= 1.)
    cerr << "\nCAUTION: You are approaching the border of NEST's validity for "
            "high-energy (OR, for LOW) NR, or are beyond it, at "
         << energy << " keV." << endl;
  if (std::abs(Nex + Ni - Nq) > 2. * PHE_MIN) {
    throw std::runtime_error(
        "ERROR: Quanta not conserved. Tell Matthew Immediately!");
  }

  double Wq_eV = wvalue.Wq_eV;
  double L = (Nq / energy) * Wq_eV * 1e-3;

  YieldResult result{};
  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  result.ExcitonRatio = NexONi;
  result.Lindhard = L;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations
}